

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlMaster::RenderData
          (EbmlMaster *this,IOCallback *output,bool bForceRender,bool bWithDefault)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference ppEVar5;
  filepos_t fVar6;
  undefined4 extraout_var;
  binary *pbVar7;
  uint64 uVar8;
  undefined1 local_80 [8];
  MemIOCallback TmpBuf;
  size_t Index;
  filepos_t Result;
  bool bWithDefault_local;
  bool bForceRender_local;
  IOCallback *output_local;
  EbmlMaster *this_local;
  
  Index = 0;
  if ((!bForceRender) && (bVar1 = CheckMandatory(this), !bVar1)) {
    __assert_fail("CheckMandatory()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                  ,0x60,
                  "virtual filepos_t libebml::EbmlMaster::RenderData(IOCallback &, bool, bool)");
  }
  if ((this->bChecksumUsed & 1U) == 0) {
    for (TmpBuf.dataBufferMemorySize = 0; uVar8 = TmpBuf.dataBufferMemorySize,
        sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                          (&this->ElementList), uVar8 < sVar4;
        TmpBuf.dataBufferMemorySize = TmpBuf.dataBufferMemorySize + 1) {
      if (bWithDefault) {
LAB_001bb85e:
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,TmpBuf.dataBufferMemorySize);
        fVar6 = EbmlElement::Render(*ppEVar5,output,bWithDefault,false,bForceRender);
        Index = fVar6 + Index;
      }
      else {
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,TmpBuf.dataBufferMemorySize);
        uVar2 = (*(*ppEVar5)->_vptr_EbmlElement[0xf])();
        if ((uVar2 & 1) == 0) goto LAB_001bb85e;
      }
    }
  }
  else {
    iVar3 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    MemIOCallback::MemIOCallback((MemIOCallback *)local_80,CONCAT44(extraout_var,iVar3) - 6);
    for (TmpBuf.dataBufferMemorySize = 0; uVar8 = TmpBuf.dataBufferMemorySize,
        sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                          (&this->ElementList), uVar8 < sVar4;
        TmpBuf.dataBufferMemorySize = TmpBuf.dataBufferMemorySize + 1) {
      if (bWithDefault) {
LAB_001bb95c:
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,TmpBuf.dataBufferMemorySize);
        EbmlElement::Render(*ppEVar5,(IOCallback *)local_80,bWithDefault,false,bForceRender);
      }
      else {
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,TmpBuf.dataBufferMemorySize);
        uVar2 = (*(*ppEVar5)->_vptr_EbmlElement[0xf])();
        if ((uVar2 & 1) == 0) goto LAB_001bb95c;
      }
    }
    pbVar7 = MemIOCallback::GetDataBuffer((MemIOCallback *)local_80);
    uVar8 = MemIOCallback::GetDataBufferSize((MemIOCallback *)local_80);
    EbmlCrc32::FillCRC32(&this->Checksum,pbVar7,(uint32)uVar8);
    fVar6 = EbmlElement::Render((EbmlElement *)&this->Checksum,output,true,false,bForceRender);
    pbVar7 = MemIOCallback::GetDataBuffer((MemIOCallback *)local_80);
    uVar8 = MemIOCallback::GetDataBufferSize((MemIOCallback *)local_80);
    IOCallback::writeFully(output,pbVar7,uVar8);
    uVar8 = MemIOCallback::GetDataBufferSize((MemIOCallback *)local_80);
    Index = uVar8 + fVar6;
    MemIOCallback::~MemIOCallback((MemIOCallback *)local_80);
  }
  return Index;
}

Assistant:

filepos_t EbmlMaster::RenderData(IOCallback & output, bool bForceRender, bool bWithDefault)
{
  filepos_t Result = 0;
  size_t Index;

  if (!bForceRender) {
    assert(CheckMandatory());
  }

  if (!bChecksumUsed) { // old school
    for (Index = 0; Index < ElementList.size(); Index++) {
      if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
        continue;
      Result += (ElementList[Index])->Render(output, bWithDefault, false ,bForceRender);
    }
  } else { // new school
    MemIOCallback TmpBuf(GetSize() - 6);
    for (Index = 0; Index < ElementList.size(); Index++) {
      if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
        continue;
      (ElementList[Index])->Render(TmpBuf, bWithDefault, false ,bForceRender);
    }
    Checksum.FillCRC32(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
    Result += Checksum.Render(output, true, false ,bForceRender);
    output.writeFully(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
    Result += TmpBuf.GetDataBufferSize();
  }

  return Result;
}